

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_terrain.cxx
# Opt level: O0

void __thiscall level_mesh::separate_terrain(level_mesh *this,uint16_t texture)

{
  undefined1 auVar1 [4];
  uint16_t uVar2;
  bool bVar3;
  pointer pbVar4;
  value_type __dest;
  size_type temp_index;
  b_model local_c0;
  value_type local_b0;
  b_model_instance *instance;
  b_face_vec_it end;
  b_face_vec_it it;
  undefined1 local_90 [4];
  uint32_t face_idx;
  b_model_instance temp;
  uint16_t texture_local;
  level_mesh *this_local;
  
  temp.xform.field_0._62_2_ = texture;
  b_model_instance::b_model_instance((b_model_instance *)local_90,this->m_free_tag,0xffff);
  end._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&(this->super_xr_mesh_builder).m_faces);
  instance = (b_model_instance *)
             std::
             vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ::end(&(this->super_xr_mesh_builder).m_faces);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                             *)&instance);
    if (!bVar3) {
      if (face_idx._2_2_ != 0xffff) {
        __dest = (value_type)operator_new(0x78);
        memcpy(__dest,local_90,0x78);
        local_b0 = __dest;
        temp_index = std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::size
                               (&this->m_instances);
        b_model::b_model(&local_c0,MT_TERRAIN,temp_index);
        std::vector<b_model,_std::allocator<b_model>_>::push_back(&this->m_models,&local_c0);
        std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::push_back
                  (&this->m_instances,&local_b0);
        this->m_free_tag = this->m_free_tag + 1;
      }
      return;
    }
    pbVar4 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end);
    if ((*(short *)&pbVar4->field_1 == temp.xform.field_0._62_2_) &&
       (pbVar4 = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                 ::operator->(&end), auVar1 = local_90, pbVar4->tag == 0xffffffff)) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator->(&end);
      uVar2 = face_idx._2_2_;
      pbVar4->tag = (uint32_t)auVar1;
      if (face_idx._2_2_ == 0xffff) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                 ::operator->(&end);
        face_idx._2_2_ = pbVar4->sector;
      }
      else {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                 ::operator->(&end);
        if (uVar2 != pbVar4->sector) {
          __assert_fail("temp.sector == it->sector",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_terrain.cxx"
                        ,0x84,"void level_mesh::separate_terrain(uint16_t)");
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

void level_mesh::separate_terrain(uint16_t texture)
{
	b_model_instance temp(m_free_tag, UINT16_MAX);
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		if (it->surface.texture != texture || it->tag != BAD_IDX)
			continue;
		it->tag = temp.tag;
		if (temp.sector == UINT16_MAX)
			temp.sector = it->sector;
		else
			xr_assert(temp.sector == it->sector);
	}
	if (temp.sector != UINT16_MAX) {
		b_model_instance* instance = new b_model_instance(temp);
		m_models.push_back(b_model(b_model::MT_TERRAIN, m_instances.size()));
		m_instances.push_back(instance);
		++m_free_tag;
	}
}